

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool setup::is_simple_expression(string *expression)

{
  bool bVar1;
  ulong uVar2;
  char *c;
  char *local_18;
  bool local_1;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_18 = (char *)std::__cxx11::string::c_str();
    bVar1 = anon_unknown_0::is_identifier_start(*local_18);
    if (bVar1) {
      for (; *local_18 != '\0'; local_18 = local_18 + 1) {
        bVar1 = anon_unknown_0::is_identifier('\0');
        if (!bVar1) {
          return false;
        }
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool is_simple_expression(const std::string & expression) {
	if(expression.empty()) {
		return true;
	}
	const char * c = expression.c_str();
	if(!is_identifier_start(*c)) {
		return false;
	}
	while(*c) {
		if(!is_identifier(*c)) {
			return false;
		}
		c++;
	}
	return true;
}